

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O1

double UF::Alloc(uint max_length,PerformanceEvaluator *perf)

{
  double dVar1;
  long lVar2;
  ulong __n;
  double dVar3;
  double dVar4;
  
  lVar2 = cv::getTickCount();
  (perf->counter_).last = (double)lVar2;
  __n = (ulong)max_length << 2;
  P_ = (uint *)operator_new__(__n);
  memset(P_,0,__n);
  lVar2 = cv::getTickCount();
  dVar3 = (double)lVar2 - (perf->counter_).last;
  (perf->counter_).last = dVar3;
  (perf->counter_).total = (perf->counter_).total + dVar3;
  dVar1 = perf->tick_frequency_;
  lVar2 = cv::getTickCount();
  (perf->counter_).last = (double)lVar2;
  memset(P_,0,__n);
  lVar2 = cv::getTickCount();
  dVar4 = (double)lVar2 - (perf->counter_).last;
  (perf->counter_).last = dVar4;
  (perf->counter_).total = (perf->counter_).total + dVar4;
  return (dVar3 * 1000.0) / dVar1 - (dVar4 * 1000.0) / perf->tick_frequency_;
}

Assistant:

static double Alloc(unsigned max_length, PerformanceEvaluator& perf) {
        perf.start();
        P_ = new unsigned[max_length];
        memset(P_, 0, max_length * sizeof(unsigned));
        perf.stop();
        double t = perf.last();
        perf.start();
        memset(P_, 0, max_length * sizeof(unsigned));
        perf.stop();
        return t - perf.last();
    }